

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

_Bool effect_handler_RESTORE_STAT(effect_handler_context_t_conflict *context)

{
  uint32_t *puVar1;
  uint index;
  player *p;
  obj_property *poVar2;
  ulong uVar3;
  
  index = context->subtype;
  uVar3 = (ulong)index;
  context->ident = true;
  p = player;
  if (uVar3 < 5) {
    if (player->stat_cur[uVar3] != player->stat_max[uVar3]) {
      player->stat_cur[uVar3] = player->stat_max[uVar3];
      puVar1 = &p->upkeep->update;
      *puVar1 = *puVar1 | 1;
      update_stuff(p);
      poVar2 = lookup_obj_property(1,index);
      msg("You feel less %s.",poVar2->neg_adj);
    }
  }
  return index < 5;
}

Assistant:

bool effect_handler_RESTORE_STAT(effect_handler_context_t *context)
{
	int stat = context->subtype;

	/* ID */
	context->ident = true;

	/* Check bounds */
	if (stat < 0 || stat >= STAT_MAX) return false;

	/* Not needed */
	if (player->stat_cur[stat] == player->stat_max[stat])
		return true;

	/* Restore */
	player->stat_cur[stat] = player->stat_max[stat];

	/* Recalculate bonuses */
	player->upkeep->update |= (PU_BONUS);
	update_stuff(player);

	/* Message */
	msg("You feel less %s.", desc_stat(stat, false));

	return (true);
}